

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O3

void co_eventloop(stCoEpoll_t *ctx,pfn_co_eventloop_t pfn,void *arg)

{
  stTimeoutItem_t **ppsVar1;
  stTimeoutItemLink_t *psVar2;
  stTimeoutItemLink_t *psVar3;
  stTimeout_t *psVar4;
  uint uVar5;
  int iVar6;
  co_epoll_res *events;
  stTimeoutItem_t *psVar7;
  stTimeoutItemLink_t *psVar8;
  stTimeoutItem_t *psVar9;
  stTimeoutItem_t *lp;
  ulong allNow;
  ulong uVar10;
  long lVar11;
  timeval local_58;
  void *local_40;
  pfn_co_eventloop_t local_38;
  
  events = ctx->result;
  local_40 = arg;
  local_38 = pfn;
  if (events == (co_epoll_res *)0x0) {
    events = co_epoll_res_alloc(0x2800);
    ctx->result = events;
  }
  do {
    uVar5 = co_epoll_wait(ctx->iEpollFd,events,0x2800,1);
    psVar2 = ctx->pstTimeoutList;
    psVar3 = ctx->pstActiveList;
    psVar2->head = (stTimeoutItem_t *)0x0;
    psVar2->tail = (stTimeoutItem_t *)0x0;
    if (0 < (int)uVar5) {
      lVar11 = 0;
      do {
        psVar7 = *(stTimeoutItem_t **)((long)&events->events->data + lVar11);
        if (psVar7->pfnPrepare == (OnPreparePfn_t)0x0) {
          if (psVar7->pLink == (stTimeoutItemLink_t *)0x0) {
            psVar9 = psVar3->tail;
            psVar8 = (stTimeoutItemLink_t *)&psVar9->pNext;
            if (psVar9 == (stTimeoutItem_t *)0x0) {
              psVar8 = psVar3;
            }
            psVar8->head = psVar7;
            psVar3->tail = psVar7;
            psVar7->pPrev = psVar9;
            psVar7->pNext = (stTimeoutItem_t *)0x0;
            psVar7->pLink = psVar3;
          }
        }
        else {
          (*psVar7->pfnPrepare)
                    (psVar7,(epoll_event *)((long)&events->events->events + lVar11),psVar3);
        }
        lVar11 = lVar11 + 0xc;
      } while ((ulong)uVar5 * 0xc != lVar11);
    }
    local_58.tv_sec = 0;
    local_58.tv_usec = 0;
    gettimeofday(&local_58,(__timezone_ptr_t)0x0);
    allNow = local_58.tv_usec / 1000 + local_58.tv_sec * 1000;
    psVar4 = ctx->pTimeout;
    uVar10 = psVar4->ullStart;
    if (uVar10 == 0) {
      psVar4->ullStart = allNow;
      psVar4->llStartIdx = 0;
      uVar10 = allNow;
LAB_00102b64:
      uVar5 = ((int)allNow - (int)uVar10) + 1;
      if (psVar4->iItemSize <= (int)uVar5) {
        uVar5 = psVar4->iItemSize;
      }
      if (-1 < (int)uVar5) {
        if (uVar5 != 0) {
          uVar10 = 0;
          do {
            lVar11 = (long)(psVar4->llStartIdx + uVar10) % (long)psVar4->iItemSize;
            psVar7 = psVar4->pItems[lVar11].head;
            if (psVar7 != (stTimeoutItem_t *)0x0) {
              psVar8 = psVar4->pItems + lVar11;
              psVar9 = psVar7;
              do {
                psVar9->pLink = psVar2;
                psVar9 = psVar9->pNext;
              } while (psVar9 != (stTimeoutItem_t *)0x0);
              psVar9 = psVar2->tail;
              if (psVar9 == (stTimeoutItem_t *)0x0) {
                psVar2->head = psVar7;
              }
              else {
                psVar9->pNext = psVar7;
                psVar7->pPrev = psVar9;
              }
              psVar2->tail = psVar8->tail;
              psVar8->head = (stTimeoutItem_t *)0x0;
              psVar8->tail = (stTimeoutItem_t *)0x0;
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 != uVar5);
        }
        psVar4->ullStart = allNow;
        psVar4->llStartIdx = (long)(int)uVar5 + psVar4->llStartIdx + -1;
      }
    }
    else if (uVar10 <= allNow) goto LAB_00102b64;
    psVar7 = psVar2->head;
    if (psVar7 != (stTimeoutItem_t *)0x0) {
      do {
        psVar7->bTimeout = true;
        psVar7 = psVar7->pNext;
      } while (psVar7 != (stTimeoutItem_t *)0x0);
      psVar7 = psVar2->head;
      psVar9 = psVar7;
      if (psVar7 != (stTimeoutItem_t *)0x0) {
        do {
          psVar9->pLink = psVar3;
          ppsVar1 = &psVar9->pNext;
          psVar9 = *ppsVar1;
        } while (*ppsVar1 != (stTimeoutItem_t *)0x0);
        psVar9 = psVar3->tail;
        if (psVar9 == (stTimeoutItem_t *)0x0) {
          psVar3->head = psVar7;
        }
        else {
          psVar9->pNext = psVar7;
          psVar7->pPrev = psVar9;
        }
        psVar3->tail = psVar2->tail;
        psVar2->head = (stTimeoutItem_t *)0x0;
        psVar2->tail = (stTimeoutItem_t *)0x0;
      }
    }
    while (psVar7 = psVar3->head, psVar7 != (stTimeoutItem_t *)0x0) {
      if (psVar7 == psVar3->tail) {
        psVar3->head = (stTimeoutItem_t *)0x0;
        psVar3->tail = (stTimeoutItem_t *)0x0;
        psVar7->pPrev = (stTimeoutItem_t *)0x0;
        psVar7->pNext = (stTimeoutItem_t *)0x0;
        psVar7->pLink = (stTimeoutItemLink_t *)0x0;
      }
      else {
        psVar9 = psVar7->pNext;
        psVar3->head = psVar9;
        psVar7->pPrev = (stTimeoutItem_t *)0x0;
        psVar7->pNext = (stTimeoutItem_t *)0x0;
        psVar7->pLink = (stTimeoutItemLink_t *)0x0;
        if (psVar9 != (stTimeoutItem_t *)0x0) {
          psVar9->pPrev = (stTimeoutItem_t *)0x0;
        }
      }
      if (((psVar7->bTimeout == true) && (allNow < psVar7->ullExpireTime)) &&
         (iVar6 = AddTimeout(ctx->pTimeout,psVar7,allNow), iVar6 == 0)) {
        psVar7->bTimeout = false;
      }
      else if (psVar7->pfnProcess != (OnProcessPfn_t)0x0) {
        (*psVar7->pfnProcess)(psVar7);
      }
    }
    if ((local_38 != (pfn_co_eventloop_t)0x0) && (iVar6 = (*local_38)(local_40), iVar6 == -1)) {
      return;
    }
  } while( true );
}

Assistant:

void co_eventloop( stCoEpoll_t *ctx,pfn_co_eventloop_t pfn,void *arg )
{
	if( !ctx->result )
	{
		ctx->result =  co_epoll_res_alloc( stCoEpoll_t::_EPOLL_SIZE );
	}
	co_epoll_res *result = ctx->result;


	for(;;)
	{
		int ret = co_epoll_wait( ctx->iEpollFd,result,stCoEpoll_t::_EPOLL_SIZE, 1 );

		stTimeoutItemLink_t *active = (ctx->pstActiveList);
		stTimeoutItemLink_t *timeout = (ctx->pstTimeoutList);

		memset( timeout,0,sizeof(stTimeoutItemLink_t) );

		for(int i=0;i<ret;i++)
		{
			stTimeoutItem_t *item = (stTimeoutItem_t*)result->events[i].data.ptr;
			if( item->pfnPrepare )
			{
				item->pfnPrepare( item,result->events[i],active );
			}
			else
			{
				AddTail( active,item );
			}
		}


		unsigned long long now = GetTickMS();
		TakeAllTimeout( ctx->pTimeout,now,timeout );

		stTimeoutItem_t *lp = timeout->head;
		while( lp )
		{
			//printf("raise timeout %p\n",lp);
			lp->bTimeout = true;
			lp = lp->pNext;
		}

		Join<stTimeoutItem_t,stTimeoutItemLink_t>( active,timeout );

		lp = active->head;
		while( lp )
		{

			PopHead<stTimeoutItem_t,stTimeoutItemLink_t>( active );
            if (lp->bTimeout && now < lp->ullExpireTime) 
			{
				int ret = AddTimeout(ctx->pTimeout, lp, now);
				if (!ret) 
				{
					lp->bTimeout = false;
					lp = active->head;
					continue;
				}
			}
			if( lp->pfnProcess )
			{
				lp->pfnProcess( lp );
			}

			lp = active->head;
		}
		if( pfn )
		{
			if( -1 == pfn( arg ) )
			{
				break;
			}
		}

	}
}